

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

int vocgtyp(voccxdef *ctx,char **cmd,int *types,char *orgbuf)

{
  uint uVar1;
  size_t sVar2;
  int checktyp;
  int iVar3;
  ulong uVar4;
  char cVar5;
  long lVar6;
  char **ppcVar7;
  char *pcVar8;
  char *__dest;
  int iVar9;
  long lVar10;
  char *pcVar11;
  int *piVar12;
  char redobuf [200];
  char oopsbuf [128];
  int local_1cc;
  char local_188 [208];
  char local_b8 [136];
  
  local_1cc = 0;
LAB_001f5b39:
  if ((ctx->voccxflg & 4) != 0) {
    outformat(". Checking words:\\n");
  }
  pcVar11 = *cmd;
  if (pcVar11 == (char *)0x0) {
LAB_001f5df6:
    ctx->voccxunknown = local_1cc;
    ctx->voccxlastunk = local_1cc;
    return 0;
  }
  lVar10 = 0;
  do {
    sVar2 = strlen(pcVar11);
    uVar1 = voc_lookup_type(ctx,pcVar11,(int)sVar2,0);
    if (uVar1 == 0) {
      iVar9 = voc_check_special(ctx,pcVar11,checktyp);
      uVar1 = 0;
      if (iVar9 == 0) {
        if ((ctx->voccxunknown != 0) &&
           (uVar1 = ctx->voccxlastunk - ctx->voccxunknown, (int)uVar1 <= local_1cc)) break;
        local_1cc = local_1cc + 1;
        uVar1 = 0x80;
      }
    }
    if ((ctx->voccxflg & 4) != 0) {
      outshow();
      iVar9 = 0;
      sprintf(local_188,"... %s (",cmd[lVar10]);
      sVar2 = strlen(local_188);
      pcVar11 = local_188 + sVar2;
      piVar12 = &type_names_rel;
      lVar6 = 0;
      do {
        if ((uVar1 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
          if (iVar9 != 0) {
            *pcVar11 = ',';
            pcVar11 = pcVar11 + 1;
          }
          strcpy(pcVar11,(char *)((long)&type_names_rel + (long)*piVar12));
          sVar2 = strlen(pcVar11);
          pcVar11 = pcVar11 + sVar2;
          iVar9 = iVar9 + 1;
        }
        lVar6 = lVar6 + 1;
        piVar12 = piVar12 + 1;
      } while (lVar6 != 8);
      builtin_strncpy(pcVar11,")\\n",4);
      outformat(local_188);
    }
    types[lVar10] = uVar1;
    pcVar11 = cmd[lVar10 + 1];
    lVar10 = lVar10 + 1;
    if (pcVar11 == (char *)0x0) goto LAB_001f5df6;
  } while( true );
  ctx->voccxunknown = 0;
  pcVar11 = voc_read_oops(ctx,local_b8,(size_t)pcVar11,(char *)(ulong)uVar1);
  if (pcVar11 == (char *)0x0) {
    strcpy(orgbuf,local_b8);
    ctx->voccxunknown = 0;
    ctx->voccxredo = 1;
    return 1;
  }
  pcVar8 = *cmd;
  __dest = local_188;
  if (pcVar8 != (char *)0x0) {
    iVar9 = 0;
    ppcVar7 = cmd;
    do {
      if (iVar9 == (int)lVar10) {
        sVar2 = 0;
        while ((0x3f < (ulong)(byte)pcVar11[sVar2] ||
               ((0x8000500200000001U >> ((ulong)(byte)pcVar11[sVar2] & 0x3f) & 1) == 0))) {
          sVar2 = sVar2 + 1;
        }
        memcpy(__dest,pcVar11,sVar2);
        pcVar8 = __dest + sVar2;
      }
      else if (*pcVar8 == '\"') {
        uVar4 = (ulong)*(ushort *)(pcVar8 + 1);
        cVar5 = '\"';
        iVar3 = (int)(uVar4 - 2);
        if (iVar3 != 0) {
          lVar6 = 0;
          do {
            if ((pcVar8 + 3)[lVar6] == '\"') {
              cVar5 = '\'';
              break;
            }
            lVar6 = lVar6 + 1;
          } while (iVar3 != (int)lVar6);
        }
        *__dest = cVar5;
        memcpy(__dest + 1,pcVar8 + 3,uVar4 - 2);
        pcVar8 = __dest + uVar4;
        __dest[uVar4 - 1] = cVar5;
      }
      else {
        sVar2 = strlen(pcVar8);
        memcpy(__dest,pcVar8,(long)(int)sVar2);
        pcVar8 = __dest + (int)sVar2;
      }
      *pcVar8 = ' ';
      __dest = pcVar8 + 1;
      iVar9 = iVar9 + 1;
      pcVar8 = ppcVar7[1];
      ppcVar7 = ppcVar7 + 1;
    } while (pcVar8 != (char *)0x0);
  }
  *__dest = '\0';
  **cmd = '\0';
  uVar1 = voctok(ctx,local_188,*cmd,cmd,0,0,1);
  if ((int)uVar1 < 1) {
    return 1;
  }
  cmd[uVar1] = (char *)0x0;
  goto LAB_001f5b39;
}

Assistant:

int vocgtyp(voccxdef *ctx, char *cmd[], int types[], char *orgbuf)
{
    int      cur;
    int      t;
    char    *p;
    int      len;
    int      unknown_count = 0;
    
startover:
    if (ctx->voccxflg & VOCCXFDBG)
        tioputs(ctx->vocxtio, ". Checking words:\\n");

    for (cur = 0 ; cmd[cur] ; ++cur)
    {
        /* get the word */
        p = cmd[cur];
        len = strlen(p);

        /* look it up */
        t = voc_lookup_type(ctx, p, len, FALSE);
        
        /* see if the word was found */
        if (t == 0 && !voc_check_special(ctx, p, VOCW_OF))
        {
            /* 
             *   We didn't find the word.  For now, set its type to
             *   "unknown".
             */
            t = VOCT_UNKNOWN;

            /*
             *   If the unknown word count is already non-zero, it means
             *   that we've tried to let the game resolve this word using
             *   the parseUnknownDobj/Iobj mechanism, but it wasn't able
             *   to do so, thus we've come back here to use the normal
             *   "oops" processing instead.
             *   
             *   Don't generate a message until we get to the first
             *   unknown word from the original list that we weren't able
             *   to resolve.  We may have been able to handle one or more
             *   of the original list of unknown words (through
             *   parseNounPhrase or other means), so we don't want to
             *   generate a message for any words we ended up handling.
             *   The number we resolved is the last full unknown count
             *   minus the remaining unknown count.  
             */
            if (ctx->voccxunknown != 0
                && unknown_count >= ctx->voccxlastunk - ctx->voccxunknown)
            {
                char  oopsbuf[VOCBUFSIZ];
                char *p1;
                
                /* 
                 *   we can try using the parseUnknownDobj/Iobj again
                 *   after this, so clear the unknown word count for now
                 */
                ctx->voccxunknown = 0;

                /* display an error, and ask for a new command */
                p1 = voc_read_oops(ctx, oopsbuf, sizeof(oopsbuf), p);

                /* if they responded with replacement text, apply it */
                if (p1 != 0)
                {
                    char   redobuf[200];
                    char  *q;
                    int    i;
                    int    wc;
                    char **w;
                    char  *outp;
                    
                    /* 
                     *   copy words from the original string, replacing
                     *   the unknown word with what follows the "oops" in
                     *   the new command 
                     */
                    for (outp = redobuf, i = 0, w = cmd ; *w != 0 ; ++i, ++w)
                    {
                        
                        /* see what we have */
                        if (i == cur)
                        {
                            /* 
                             *   We've reached the word to be replaced.
                             *   Ignore the original token, and replace it
                             *   with the word or words from the OOPS
                             *   command 
                             */
                            for (q = p1, len = 0 ;
                                 *q != '\0' && *q != '.' && *q != ','
                                     && *q != '?' && *q != '!' ; ++q, ++len) ;
                            memcpy(outp, p1, (size_t)len);
                            outp += len;
                        }
                        else if (**w == '"')
                        {
                            char *strp;
                            char *p2;
                            char qu;
                            int rem;

                            /* 
                             *   It's a string - add a quote mark, then
                             *   copy the string as indicated by the
                             *   length prefix, then add another quote
                             *   mark.  Get the length by reading the
                             *   length prefix following the quote mark,
                             *   and get a pointer to the text of the
                             *   string, which immediately follows the
                             *   length prefix.  
                             */
                            len = osrp2(*w + 1) - 2;
                            strp = *w + 3;

                            /*
                             *   We need to figure out what kind of quote
                             *   mark to use.  If the string contains any
                             *   embedded double quotes, use single quotes
                             *   to delimit the string; otherwise, use
                             *   double quotes.  Presume we'll use double
                             *   quotes as the delimiter, then scan the
                             *   string for embedded double quotes.  
                             */
                            for (qu = '"', p2 = strp, rem = len ; rem != 0 ;
                                 --rem, ++p2)
                            {
                                /* 
                                 *   if this is an embedded double quote,
                                 *   use single quotes to delimite the
                                 *   string 
                                 */
                                if (*p2 == '"')
                                {
                                    /* use single quotes as delimiters */
                                    qu = '\'';

                                    /* no need to look any further */
                                    break;
                                }
                            }

                            /* add the open quote */
                            *outp++ = qu;

                            /* copy the string */
                            memcpy(outp, strp, len);
                            outp += len;

                            /* add the close quote */
                            *outp++ = qu;
                        }
                        else
                        {
                            /* 
                             *   it's an ordinary token - copy the
                             *   null-terminated string for the token from
                             *   the original command list 
                             */
                            len = strlen(*w);
                            memcpy(outp, *w, (size_t)len);
                            outp += len;
                        }

                        /* add a space between words */
                        *outp++ = ' ';
                    }
                    
                    /* terminate the new string */
                    *outp = '\0';
                    
                    /* try tokenizing the string */
                    *(cmd[0]) = '\0';
                    if ((wc = voctok(ctx, redobuf, cmd[0],
                                     cmd, FALSE, FALSE, TRUE)) <= 0)
                        return 1;
                    cmd[wc] = 0;

                    /* start over with the typing */
                    goto startover;
                }
                else
                {
                    /* 
                     *   They didn't start the command with "oops", so
                     *   this must be a brand new command.  Replace the
                     *   original command with the new command.  
                     */
                    strcpy(orgbuf, oopsbuf);

                    /* 
                     *   forget we had an unknown word so that we're sure
                     *   to start over with a new command 
                     */
                    ctx->voccxunknown = 0;
                    
                    /* 
                     *   set the "redo" flag to start over with the new
                     *   command 
                     */
                    ctx->voccxredo = 1;
                    
                    /* 
                     *   return an error to indicate the current command
                     *   has been aborted 
                     */
                    return 1;
                }
            }
            else
            {
                /*
                 *   We've now encountered an unknown word, and we're
                 *   going to defer resolution.  Remember this; we'll
                 *   count the unknown word in the context when we return
                 *   (do so only locally for now, since we may encounter
                 *   more unknown words before we return, in which case we
                 *   want to know that this is still the first pass).  
                 */
                ++unknown_count;
            }
        }

        /* display if in debug mode */
        if (ctx->voccxflg & VOCCXFDBG)
        {
            char    buf[128];
            size_t  i;
            char   *p;
            int     cnt;
            
            (void)tioshow(ctx->voccxtio);
            sprintf(buf, "... %s (", cmd[cur]);
            p = buf + strlen(buf);
            cnt = 0;
            for (i = 0 ; i < sizeof(type_names)/sizeof(type_names[0]) ; ++i)
            {
                if (t & (1 << i))
                {
                    if (cnt) *p++ = ',';
                    strcpy(p, type_names[i]);
                    p += strlen(p);
                    ++cnt;
                }
            }
            *p++ = ')';
            *p++ = '\\';
            *p++ = 'n';
            *p = '\0';
            tioputs(ctx->voccxtio, buf);
        }
        
        types[cur] = t;                         /* record type of this word */
    }

    /* if we found any unknown words, note this in our context */
    ctx->voccxunknown = unknown_count;
    ctx->voccxlastunk = unknown_count;
    
    /* successful acquisition of types */
    return 0;
}